

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall
wasm::ModuleUtils::CallGraphPropertyAnalysis<Info>::propagateBack
          (CallGraphPropertyAnalysis<Info> *this,function<bool_(const_Info_&)> *hasProperty,
          function<bool_(const_Info_&)> *canHaveProperty,function<void_(Info_&)> *addProperty,
          function<void_(const_Info_&,_wasm::Function_*)> *logVisit,NonDirectCalls nonDirectCalls)

{
  pointer puVar1;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  Map *this_00;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar6;
  undefined1 local_e8 [8];
  UniqueDeferredQueue<wasm::Function_*> work;
  _Head_base<0UL,_wasm::Function_*,_false> local_40;
  Function *caller;
  Function *func_1;
  
  work.count._M_h._M_single_bucket = (__node_base_ptr)logVisit;
  UniqueDeferredQueue<wasm::Function_*>::UniqueDeferredQueue
            ((UniqueDeferredQueue<wasm::Function_*> *)local_e8);
  puVar6 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->map;
  do {
    if (puVar6 == puVar1) {
      while( true ) {
        bVar2 = UniqueDeferredQueue<wasm::Function_*>::empty
                          ((UniqueDeferredQueue<wasm::Function_*> *)local_e8);
        if (bVar2) break;
        caller = UniqueDeferredQueue<wasm::Function_*>::pop
                           ((UniqueDeferredQueue<wasm::Function_*> *)local_e8);
        pmVar3 = std::
                 map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                 ::operator[](this_00,&caller);
        for (p_Var5 = (pmVar3->super_FunctionInfo).calledBy._M_t._M_impl.super__Rb_tree_header.
                      _M_header._M_left;
            (_Rb_tree_header *)p_Var5 !=
            &(pmVar3->super_FunctionInfo).calledBy._M_t._M_impl.super__Rb_tree_header;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          local_40._M_head_impl = *(Function **)(p_Var5 + 1);
          pmVar4 = std::
                   map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                   ::operator[](this_00,&local_40._M_head_impl);
          bVar2 = std::function<bool_(const_Info_&)>::operator()(canHaveProperty,pmVar4);
          if (bVar2) {
            pmVar4 = std::
                     map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                     ::operator[](this_00,&local_40._M_head_impl);
            std::function<void_(const_Info_&,_wasm::Function_*)>::operator()
                      ((function<void_(const_Info_&,_wasm::Function_*)> *)
                       work.count._M_h._M_single_bucket,pmVar4,caller);
            pmVar4 = std::
                     map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                     ::operator[](this_00,&local_40._M_head_impl);
            bVar2 = std::function<bool_(const_Info_&)>::operator()(hasProperty,pmVar4);
            if (!bVar2) {
              pmVar4 = std::
                       map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                       ::operator[](this_00,&local_40._M_head_impl);
              std::function<void_(Info_&)>::operator()(addProperty,pmVar4);
              UniqueDeferredQueue<wasm::Function_*>::push
                        ((UniqueDeferredQueue<wasm::Function_*> *)local_e8,local_40._M_head_impl);
            }
          }
        }
      }
      UniqueDeferredQueue<wasm::Function_*>::~UniqueDeferredQueue
                ((UniqueDeferredQueue<wasm::Function_*> *)local_e8);
      return;
    }
    caller = (puVar6->_M_t).
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pmVar3 = std::
             map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
             ::operator[](this_00,&caller);
    bVar2 = std::function<bool_(const_Info_&)>::operator()(hasProperty,pmVar3);
    if (bVar2) {
LAB_00afeb2f:
      caller = (puVar6->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pmVar3 = std::
               map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
               ::operator[](this_00,&caller);
      std::function<void_(Info_&)>::operator()(addProperty,pmVar3);
      UniqueDeferredQueue<wasm::Function_*>::push
                ((UniqueDeferredQueue<wasm::Function_*> *)local_e8,
                 (puVar6->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    }
    else if (nonDirectCalls == NonDirectCallsHaveProperty) {
      local_40._M_head_impl =
           (puVar6->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pmVar3 = std::
               map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
               ::operator[](this_00,&local_40._M_head_impl);
      if ((pmVar3->super_FunctionInfo).hasNonDirectCall != false) goto LAB_00afeb2f;
    }
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

void propagateBack(std::function<bool(const T&)> hasProperty,
                     std::function<bool(const T&)> canHaveProperty,
                     std::function<void(T&)> addProperty,
                     std::function<void(const T&, Function*)> logVisit,
                     NonDirectCalls nonDirectCalls) {
    // The work queue contains items we just learned can change the state.
    UniqueDeferredQueue<Function*> work;
    for (auto& func : wasm.functions) {
      if (hasProperty(map[func.get()]) ||
          (nonDirectCalls == NonDirectCallsHaveProperty &&
           map[func.get()].hasNonDirectCall)) {
        addProperty(map[func.get()]);
        work.push(func.get());
      }
    }
    while (!work.empty()) {
      auto* func = work.pop();
      for (auto* caller : map[func].calledBy) {
        // Skip functions forbidden from getting this property.
        if (!canHaveProperty(map[caller])) {
          continue;
        }
        // Log now, even if the function already has the property.
        logVisit(map[caller], func);
        // If we don't already have the property, then add it now, and propagate
        // further.
        if (!hasProperty(map[caller])) {
          addProperty(map[caller]);
          work.push(caller);
        }
      }
    }
  }